

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_unrolled_unary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t operand,char *op)

{
  bool forwarding;
  uint uVar1;
  SPIRType *type;
  uint32_t index;
  string expr;
  string local_70;
  string local_50;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    result_type);
  type_to_glsl_constructor_abi_cxx11_(&local_50,this,type);
  ::std::__cxx11::string::push_back((char)&local_50);
  if (type->vecsize != 0) {
    index = 0;
    do {
      ::std::__cxx11::string::append((char *)&local_50);
      to_extract_component_expression_abi_cxx11_(&local_70,this,operand,index);
      ::std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      index = index + 1;
      uVar1 = type->vecsize;
      if (index < uVar1) {
        ::std::__cxx11::string::append((char *)&local_50);
        uVar1 = type->vecsize;
      }
    } while (index < uVar1);
  }
  ::std::__cxx11::string::push_back((char)&local_50);
  forwarding = should_forward(this,operand);
  emit_op(this,result_type,result_id,&local_50,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,operand);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_unrolled_unary_op(uint32_t result_type, uint32_t result_id, uint32_t operand, const char *op)
{
	auto &type = get<SPIRType>(result_type);
	auto expr = type_to_glsl_constructor(type);
	expr += '(';
	for (uint32_t i = 0; i < type.vecsize; i++)
	{
		// Make sure to call to_expression multiple times to ensure
		// that these expressions are properly flushed to temporaries if needed.
		expr += op;
		expr += to_extract_component_expression(operand, i);

		if (i + 1 < type.vecsize)
			expr += ", ";
	}
	expr += ')';
	emit_op(result_type, result_id, expr, should_forward(operand));

	inherit_expression_dependencies(result_id, operand);
}